

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void * __thiscall
pugi::impl::anon_unknown_0::xpath_allocator::allocate(xpath_allocator *this,size_t size)

{
  ulong uVar1;
  xpath_memory_block *pxVar2;
  ulong local_60;
  xpath_memory_block *block;
  size_t block_size;
  size_t block_capacity;
  size_t block_capacity_req;
  size_t block_capacity_base;
  void *buf;
  size_t size_local;
  xpath_allocator *this_local;
  
  uVar1 = size + 7 & 0xfffffffffffffff8;
  if (this->_root->capacity < this->_root_size + uVar1) {
    local_60 = uVar1 + 0x400;
    if (local_60 < 0x1000) {
      local_60 = 0x1000;
    }
    pxVar2 = (xpath_memory_block *)
             (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::allocate)
                       (local_60 + 0x10);
    if (pxVar2 == (xpath_memory_block *)0x0) {
      if (this->_error != (bool *)0x0) {
        *this->_error = true;
      }
      this_local = (xpath_allocator *)0x0;
    }
    else {
      pxVar2->next = this->_root;
      pxVar2->capacity = local_60;
      this->_root = pxVar2;
      this->_root_size = uVar1;
      this_local = (xpath_allocator *)&pxVar2->field_2;
    }
  }
  else {
    this_local = (xpath_allocator *)((long)&this->_root->field_2 + this->_root_size);
    this->_root_size = uVar1 + this->_root_size;
  }
  return this_local;
}

Assistant:

void* allocate(size_t size)
		{
			// round size up to block alignment boundary
			size = (size + xpath_memory_block_alignment - 1) & ~(xpath_memory_block_alignment - 1);

			if (_root_size + size <= _root->capacity)
			{
				void* buf = &_root->data[0] + _root_size;
				_root_size += size;
				return buf;
			}
			else
			{
				// make sure we have at least 1/4th of the page free after allocation to satisfy subsequent allocation requests
				size_t block_capacity_base = sizeof(_root->data);
				size_t block_capacity_req = size + block_capacity_base / 4;
				size_t block_capacity = (block_capacity_base > block_capacity_req) ? block_capacity_base : block_capacity_req;

				size_t block_size = block_capacity + offsetof(xpath_memory_block, data);

				xpath_memory_block* block = static_cast<xpath_memory_block*>(xml_memory::allocate(block_size));
				if (!block)
				{
					if (_error) *_error = true;
					return 0;
				}

				block->next = _root;
				block->capacity = block_capacity;

				_root = block;
				_root_size = size;

				return block->data;
			}
		}